

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O1

void wallet::feebumper::feebumper_tests::CheckMaxWeightComputation
               (string *script_str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *witness_str_stack,string *prevout_script_str,int64_t expected_max_weight)

{
  CScript *args;
  long lVar1;
  pointer pbVar2;
  Txid hashPrevTx;
  CScript scriptSigIn;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  SignatureWeightChecker *checker;
  iterator pvVar6;
  iterator pvVar7;
  pointer pbVar8;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined4 uVar9;
  undefined4 uVar10;
  check_type cVar11;
  _func_int **in_stack_fffffffffffffd88;
  bool in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd91;
  undefined8 in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  SignatureWeightChecker size_checker;
  SignatureWeights weights;
  int64_t weight;
  vector<unsigned_char,_std::allocator<unsigned_char>_> prevout_script_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_data;
  int64_t expected_max_weight_local;
  int64_t *local_1a0;
  assertion_result local_198;
  int64_t **local_180;
  int64_t *local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  int64_t **local_158;
  char *local_150;
  char *local_148;
  assertion_result local_140;
  CScript prevout_script;
  direct_or_indirect local_108;
  uint local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  CTxIn input;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (script_str->_M_dataplus)._M_p;
  hex_str._M_len = script_str->_M_string_length;
  expected_max_weight_local = expected_max_weight;
  ParseHex<unsigned_char>(&script_data,hex_str);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&script.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish);
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_108.indirect_contents,
             &script.super_CScriptBase);
  uVar9 = (undefined4)local_d8;
  uVar10 = (undefined4)((ulong)local_d8 >> 0x20);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = (undefined1)uStack_e0;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = uStack_e0._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = uStack_e0._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = uStack_e0._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = uStack_e0._4_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = uStack_e0._5_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = uStack_e0._6_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = uStack_e0._7_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (undefined1)local_e8;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_e8._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_e8._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_e8._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_e8._4_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_e8._5_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_e8._6_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_e8._7_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (char)uVar9;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((uint)uVar9 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((uint)uVar9 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((uint)uVar9 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = (char)uVar10;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((uint)uVar10 >> 8);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((uint)uVar10 >> 0x10);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((uint)uVar10 >> 0x18);
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)uStack_d0;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_d0._1_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_d0._2_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_d0._3_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_d0._4_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_d0._5_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_d0._6_1_;
  hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_d0._7_1_;
  scriptSigIn.super_CScriptBase._union.direct[8] = in_stack_fffffffffffffd90;
  scriptSigIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffd88;
  scriptSigIn.super_CScriptBase._union._9_7_ = in_stack_fffffffffffffd91;
  scriptSigIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffffd98;
  scriptSigIn.super_CScriptBase._24_8_ = in_stack_fffffffffffffda0;
  CTxIn::CTxIn(&input,hashPrevTx,0,scriptSigIn,(uint32_t)&local_108);
  if (0x1c < local_ec) {
    free(local_108.indirect_contents.indirect);
    local_108.indirect_contents.indirect = (char *)0x0;
  }
  pbVar8 = (witness_str_stack->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (witness_str_stack->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar2) {
    do {
      hex_str_00._M_str = (pbVar8->_M_dataplus)._M_p;
      hex_str_00._M_len = pbVar8->_M_string_length;
      ParseHex<unsigned_char>(&local_170,hex_str_00);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&input.scriptWitness,&local_170);
      if ((TransactionSerParams *)
          local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (TransactionSerParams *)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_170.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar2);
  }
  hex_str_01._M_str = (prevout_script_str->_M_dataplus)._M_p;
  hex_str_01._M_len = prevout_script_str->_M_string_length;
  ParseHex<unsigned_char>(&prevout_script_data,hex_str_01);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&prevout_script.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )prevout_script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )prevout_script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = &::TX_NO_WITNESS.allow_witness;
  args = &input.scriptSig;
  local_198._0_8_ = (undefined **)0x24;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_198;
  SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_170,
             &args->super_CScriptBase);
  *(size_t *)
   local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_finish =
       (size_t)((long)*(size_t *)
                       local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 4);
  uVar3 = local_198._0_8_;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = &::TX_WITH_WITNESS.allow_witness;
  local_198._0_8_ = (undefined **)0x24;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_198;
  SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_170,
             &args->super_CScriptBase);
  *(size_t *)
   local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_finish =
       (size_t)((long)*(size_t *)
                       local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 4);
  uVar4 = local_198._0_8_;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  VectorFormatter<DefaultFormatter>::
  Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((VectorFormatter<DefaultFormatter> *)&local_198,(SizeComputer *)&local_170,
             &input.scriptWitness.stack);
  weight = (int64_t)(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar4 + uVar3 * 3);
  size_checker.m_weights = &weights;
  weights.m_sigs_count = 0;
  weights.m_sigs_weight = 0;
  checker = &size_checker;
  size_checker.super_DeferringSignatureChecker.m_checker = DUMMY_CHECKER;
  size_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker._vptr_BaseSignatureChecker
       = (_func_int **)&PTR_CheckECDSASignature_013b2ae0;
  pvVar6 = (iterator)0x0;
  bVar5 = VerifyScript(args,&prevout_script,&input.scriptWitness,0x1fffdf,
                       (BaseSignatureChecker *)checker,(ScriptError *)0x0);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x7cc88e;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_218;
  msg.m_end = pvVar6;
  msg.m_begin = (iterator)checker;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_228,msg);
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar5;
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_230 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_158 = (int64_t **)&stack0xfffffffffffffd88;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)&local_170,1,0,WARN,_cVar11,(size_t)&local_238,0x25);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  weight = weight + ((long)weights.m_sigs_count * 0x48 - weights.m_sigs_weight);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x27;
  file_00.m_begin = (iterator)&local_248;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  local_178 = &weight;
  local_1a0 = &expected_max_weight_local;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(weight == expected_max_weight_local);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_148 = "";
  local_158 = &local_178;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abed0;
  local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1a0;
  local_198.m_message.px = (element_type *)((ulong)local_198.m_message.px & 0xffffffffffffff00);
  local_198._0_8_ = &PTR__lazy_ostream_013abed0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&stack0xfffffffffffffd88,1,2,REQUIRE,0xfc65ef,
             (size_t)&local_150,0x27,(lazy_ostream *)&local_170,"expected_max_weight",
             (int)&local_198);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  if (0x1c < prevout_script.super_CScriptBase._size) {
    free(prevout_script.super_CScriptBase._union.indirect_contents.indirect);
    prevout_script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (prevout_script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(prevout_script_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)prevout_script_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)prevout_script_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&input.scriptWitness.stack);
  if (0x1c < input.scriptSig.super_CScriptBase._size) {
    free(input.scriptSig.super_CScriptBase._union.indirect_contents.indirect);
    input.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < script.super_CScriptBase._size) {
    free(script.super_CScriptBase._union.indirect_contents.indirect);
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(script_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)script_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)script_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckMaxWeightComputation(const std::string& script_str, const std::vector<std::string>& witness_str_stack, const std::string& prevout_script_str, int64_t expected_max_weight)
{
    std::vector script_data(ParseHex(script_str));
    CScript script(script_data.begin(), script_data.end());
    CTxIn input(Txid{}, 0, script);

    for (const auto& s : witness_str_stack) {
        input.scriptWitness.stack.push_back(ParseHex(s));
    }

    std::vector prevout_script_data(ParseHex(prevout_script_str));
    CScript prevout_script(prevout_script_data.begin(), prevout_script_data.end());

    int64_t weight = GetTransactionInputWeight(input);
    SignatureWeights weights;
    SignatureWeightChecker size_checker(weights, DUMMY_CHECKER);
    bool script_ok = VerifyScript(input.scriptSig, prevout_script, &input.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, size_checker);
    BOOST_CHECK(script_ok);
    weight += weights.GetWeightDiffToMax();
    BOOST_CHECK_EQUAL(weight, expected_max_weight);
}